

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.c
# Opt level: O3

void sha256_calc(uint8_t *hash,void *input,size_t len)

{
  long lVar1;
  long lVar2;
  long lVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  void *pvVar11;
  long lVar12;
  uint uVar13;
  ulong uVar14;
  int iVar15;
  undefined1 *__s;
  uint uVar16;
  uint32_t h [8];
  uint8_t chunk [64];
  uint32_t w [64];
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c0;
  int local_1b4;
  undefined8 local_1b0;
  uint8_t *local_1a8;
  ulong local_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  uint local_138 [66];
  
  local_188 = 0x9b05688c510e527f;
  uStack_180 = 0x5be0cd191f83d9ab;
  local_198 = 0xbb67ae856a09e667;
  uStack_190 = 0xa54ff53a3c6ef372;
  local_1b4 = (int)len * 8;
  uVar10 = len >> 5;
  local_1b0 = 0;
  local_1a8 = hash;
  local_1a0 = uVar10;
  do {
    if (len < 0x40) {
      memcpy(&local_178,input,len);
      __s = (undefined1 *)((long)&local_178 + len);
      lVar12 = 0x40;
      if ((int)local_1b0 == 0) {
        *__s = 0x80;
        __s = (undefined1 *)((long)&local_178 + len + 1);
        lVar12 = 0x3f;
        local_1b0 = 1;
      }
      input = (void *)((long)input + len);
      uVar10 = lVar12 - len;
      if (uVar10 < 8) {
        pvVar11 = memset(__s,0,uVar10);
        local_1c0 = CONCAT71((int7)((ulong)pvVar11 >> 8),1);
      }
      else {
        memset(__s,0,uVar10 - 8);
        __s[uVar10 - 1] = (char)local_1b4;
        lVar12 = 7;
        uVar14 = local_1a0;
        do {
          __s[lVar12 + (uVar10 - 9)] = (char)uVar14;
          uVar14 = uVar14 >> 8;
          lVar12 = lVar12 + -1;
        } while (lVar12 != 0);
        local_1c0 = 0;
      }
      len = 0;
    }
    else {
      local_178 = *input;
      uStack_170 = *(undefined8 *)((long)input + 8);
      local_168 = *(undefined8 *)((long)input + 0x10);
      uStack_160 = *(undefined8 *)((long)input + 0x18);
      local_158 = *(undefined8 *)((long)input + 0x20);
      uStack_150 = *(undefined8 *)((long)input + 0x28);
      local_148 = *(undefined8 *)((long)input + 0x30);
      uStack_140 = *(undefined8 *)((long)input + 0x38);
      input = (void *)((long)input + 0x40);
      len = len - 0x40;
      local_1c0 = CONCAT71((int7)(uVar10 >> 8),1);
    }
    memset(local_138,0,0x100);
    lVar12 = 0;
    do {
      uVar13 = *(uint *)((long)&local_178 + lVar12 * 4);
      local_138[lVar12] =
           uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 | uVar13 << 0x18;
      lVar12 = lVar12 + 1;
    } while (lVar12 != 0x10);
    lVar12 = 0x10;
    uVar13 = local_138[0];
    do {
      uVar16 = *(uint *)((long)&local_178 + lVar12 * 4 + 4);
      uVar4 = local_138[lVar12 + -2];
      local_138[lVar12] =
           (uVar16 >> 3 ^ (uVar16 << 0xe | uVar16 >> 0x12) ^ (uVar16 << 0x19 | uVar16 >> 7)) +
           uVar13 + *(int *)((long)&local_158 + lVar12 * 4 + 4) +
           (uVar4 >> 10 ^ (uVar4 << 0xd | uVar4 >> 0x13) ^ (uVar4 << 0xf | uVar4 >> 0x11));
      lVar12 = lVar12 + 1;
      uVar13 = uVar16;
    } while (lVar12 != 0x40);
    local_1d8 = local_188;
    uStack_1d0 = uStack_180;
    local_1e8 = local_198;
    uStack_1e0 = uStack_190;
    local_1d8._0_4_ = (uint)local_188;
    local_1d8._4_4_ = (uint)((ulong)local_188 >> 0x20);
    uStack_1d0._0_4_ = (uint)uStack_180;
    uStack_1d0._4_4_ = (uint)((ulong)uStack_180 >> 0x20);
    local_1e8._0_4_ = (uint)local_198;
    local_1e8._4_4_ = (uint)((ulong)local_198 >> 0x20);
    uStack_1e0._0_4_ = (uint)uStack_190;
    uStack_1e0._4_4_ = (uint)((ulong)uStack_190 >> 0x20);
    lVar12 = 0;
    do {
      uVar16 = (uint)uStack_1e0;
      uStack_1e0._0_4_ = local_1e8._4_4_;
      local_1e8._4_4_ = (uint)local_1e8;
      uVar13 = (uint)uStack_1d0;
      uStack_1d0._0_4_ = local_1d8._4_4_;
      local_1d8._4_4_ = (uint)local_1d8;
      iVar15 = (~local_1d8._4_4_ & uVar13) + ((uint)uStack_1d0 & local_1d8._4_4_) + uStack_1d0._4_4_
               + ((local_1d8._4_4_ << 7 | local_1d8._4_4_ >> 0x19) ^
                 (local_1d8._4_4_ << 0x15 | local_1d8._4_4_ >> 0xb) ^
                 (local_1d8._4_4_ << 0x1a | local_1d8._4_4_ >> 6)) + *(int *)((long)k + lVar12) +
               *(int *)((long)local_138 + lVar12);
      local_1d8._0_4_ = uStack_1e0._4_4_ + iVar15;
      local_1e8._0_4_ =
           (uVar16 & (uint)uStack_1e0 ^ (uVar16 ^ (uint)uStack_1e0) & local_1e8._4_4_) +
           ((local_1e8._4_4_ << 10 | local_1e8._4_4_ >> 0x16) ^
           (local_1e8._4_4_ << 0x13 | local_1e8._4_4_ >> 0xd) ^
           (local_1e8._4_4_ << 0x1e | local_1e8._4_4_ >> 2)) + iVar15;
      lVar12 = lVar12 + 4;
      uStack_1d0._4_4_ = uVar13;
      uStack_1e0._4_4_ = uVar16;
    } while (lVar12 != 0x100);
    uStack_1d0 = CONCAT44(uVar13,(uint)uStack_1d0);
    uStack_1e0 = CONCAT44(uVar16,(uint)uStack_1e0);
    lVar12 = 0;
    do {
      lVar2 = lVar12 * 4;
      iVar15 = *(int *)((long)&local_198 + lVar2 + 4);
      iVar5 = *(int *)((long)&uStack_190 + lVar2);
      iVar6 = *(int *)((long)&uStack_190 + lVar2 + 4);
      lVar1 = lVar12 * 4;
      iVar7 = *(int *)((long)&local_1e8 + lVar1 + 4);
      iVar8 = *(int *)((long)&uStack_1e0 + lVar1);
      iVar9 = *(int *)((long)&uStack_1e0 + lVar1 + 4);
      lVar3 = lVar12 * 4;
      *(int *)((long)&local_198 + lVar3) =
           *(int *)((long)&local_198 + lVar2) + *(int *)((long)&local_1e8 + lVar1);
      *(int *)((long)&local_198 + lVar3 + 4) = iVar15 + iVar7;
      *(int *)((long)&uStack_190 + lVar3) = iVar5 + iVar8;
      *(int *)((long)&uStack_190 + lVar3 + 4) = iVar6 + iVar9;
      lVar12 = lVar12 + 4;
    } while (lVar12 != 8);
    uVar10 = 0;
  } while ((char)local_1c0 != '\0');
  lVar12 = 0;
  do {
    uVar13 = *(uint *)((long)&local_198 + lVar12 * 4);
    *(uint *)(local_1a8 + lVar12 * 4) =
         uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 | uVar13 << 0x18;
    lVar12 = lVar12 + 1;
  } while (lVar12 != 8);
  return;
}

Assistant:

void sha256_calc(uint8_t hash[32], const void * input, size_t len)
{
   uint32_t h[] = { 0x6a09e667, 0xbb67ae85, 0x3c6ef372, 0xa54ff53a, 0x510e527f, 0x9b05688c, 0x1f83d9ab, 0x5be0cd19 };
   int i, j;

   uint8_t chunk[64];

   struct buffer_state state;

   init_buf_state(&state, input, len);

   while (calc_chunk(chunk, &state)) {
      uint32_t ah[8];

      uint32_t w[64];
      const uint8_t *p = chunk;

      memset(w, 0x00, sizeof w);
      for (i = 0; i < 16; i++) {
         w[i] = (uint32_t) p[0] << 24 | (uint32_t) p[1] << 16 |
            (uint32_t) p[2] << 8 | (uint32_t) p[3];
         p += 4;
      }

      for (i = 16; i < 64; i++) {
         const uint32_t s0 = right_rot(w[i - 15], 7) ^ right_rot(w[i - 15], 18) ^ (w[i - 15] >> 3);
         const uint32_t s1 = right_rot(w[i - 2], 17) ^ right_rot(w[i - 2], 19) ^ (w[i - 2] >> 10);
         w[i] = w[i - 16] + s0 + w[i - 7] + s1;
      }

      for (i = 0; i < 8; i++)
         ah[i] = h[i];

      for (i = 0; i < 64; i++) {
         const uint32_t s1 = right_rot(ah[4], 6) ^ right_rot(ah[4], 11) ^ right_rot(ah[4], 25);
         const uint32_t ch = (ah[4] & ah[5]) ^ (~ah[4] & ah[6]);
         const uint32_t temp1 = ah[7] + s1 + ch + k[i] + w[i];
         const uint32_t s0 = right_rot(ah[0], 2) ^ right_rot(ah[0], 13) ^ right_rot(ah[0], 22);
         const uint32_t maj = (ah[0] & ah[1]) ^ (ah[0] & ah[2]) ^ (ah[1] & ah[2]);
         const uint32_t temp2 = s0 + maj;

         ah[7] = ah[6];
         ah[6] = ah[5];
         ah[5] = ah[4];
         ah[4] = ah[3] + temp1;
         ah[3] = ah[2];
         ah[2] = ah[1];
         ah[1] = ah[0];
         ah[0] = temp1 + temp2;
      }

      for (i = 0; i < 8; i++)
         h[i] += ah[i];
   }

   for (i = 0, j = 0; i < 8; i++)
   {
      hash[j++] = (uint8_t) (h[i] >> 24);
      hash[j++] = (uint8_t) (h[i] >> 16);
      hash[j++] = (uint8_t) (h[i] >> 8);
      hash[j++] = (uint8_t) h[i];
   }
}